

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O2

ResponseLine * __thiscall
DeselectGenericCommand::trigger(DeselectGenericCommand *this,string_view parameters)

{
  long lVar1;
  ResponseLine *pRVar2;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  lVar1 = IRCCommand::selected_server;
  pRVar2 = (ResponseLine *)operator_new(0x30);
  if (lVar1 == 0) {
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar2,0x24,"No IRC server is currently selected.",0);
  }
  else {
    local_28 = (basic_string_view<char,_std::char_traits<char>_>)
               Jupiter::IRC::Client::getConfigSection();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,&local_28,&local_89);
    s_abi_cxx11_(&local_88," has been deselected.",0x15);
    std::operator+(&local_48,&local_68,&local_88);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_48,0);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    IRCCommand::selected_server = 0;
    IRCCommand::active_server = 0;
  }
  return pRVar2;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *DeselectGenericCommand::trigger(std::string_view parameters)
{
	if (IRCCommand::selected_server == nullptr)
		return new Jupiter::GenericCommand::ResponseLine("No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicSuccess);

	Jupiter::GenericCommand::ResponseLine *ret = new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " has been deselected."s, GenericCommand::DisplayType::PublicSuccess);
	IRCCommand::selected_server = nullptr;
	IRCCommand::active_server = IRCCommand::selected_server;
	return ret;
}